

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O0

void __thiscall
slang::ast::SequenceRepetition::serializeTo(SequenceRepetition *this,ASTSerializer *serializer)

{
  int iVar1;
  ASTSerializer *in_RSI;
  basic_string_view<char,_std::char_traits<char>_> *in_RDI;
  basic_string_view<char,_std::char_traits<char>_> bVar2;
  size_t in_stack_ffffffffffffff68;
  char *in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff78;
  size_t local_70;
  int local_60;
  void *local_58;
  size_t local_50;
  int local_40;
  ASTSerializer *in_stack_ffffffffffffffc8;
  SequenceRange *in_stack_ffffffffffffffd0;
  int local_20;
  void *local_18;
  
  ASTSerializer::startObject((ASTSerializer *)0x7d3361);
  iVar1 = (int)in_RDI->_M_len;
  if (iVar1 == 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(in_RDI,(char *)in_RSI);
    bVar2 = sv(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    in_stack_ffffffffffffffd0 = (SequenceRange *)bVar2._M_len;
    ASTSerializer::write(in_RSI,local_20,local_18,(size_t)in_stack_ffffffffffffffd0);
  }
  else if (iVar1 == 1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_RDI,in_stack_ffffffffffffff78);
    bVar2 = sv((char *)in_RSI,in_stack_ffffffffffffff68);
    local_50 = bVar2._M_len;
    ASTSerializer::write(in_RSI,local_40,in_stack_ffffffffffffffc8,local_50);
  }
  else if (iVar1 == 2) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_RDI,in_stack_ffffffffffffff78);
    bVar2 = sv(in_stack_ffffffffffffff70,(size_t)in_RSI);
    local_70 = bVar2._M_len;
    ASTSerializer::write(in_RSI,local_60,local_58,local_70);
  }
  SequenceRange::serializeTo(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  ASTSerializer::endObject((ASTSerializer *)0x7d34bf);
  return;
}

Assistant:

void SequenceRepetition::serializeTo(ASTSerializer& serializer) const {
    serializer.startObject();

    switch (kind) {
        case Consecutive:
            serializer.write("kind", "Consecutive"sv);
            break;
        case Nonconsecutive:
            serializer.write("kind", "Nonconsecutive"sv);
            break;
        case GoTo:
            serializer.write("kind", "GoTo"sv);
            break;
    }

    range.serializeTo(serializer);
    serializer.endObject();
}